

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

int __thiscall
DirectChainedMap<IdentifierLookupResult>::remove
          (DirectChainedMap<IdentifierLookupResult> *this,char *__filename)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  Node *pNVar4;
  Node *local_48;
  Node *prev;
  Node *curr;
  Node *start;
  uint bucket;
  uint bucketMask;
  uint hash_local;
  DirectChainedMap<IdentifierLookupResult> *this_local;
  IdentifierLookupResult value_local;
  
  pNVar4 = this->data + (ulong)((uint)__filename & this->bucketCount - 1) * 0x20;
  local_48 = (Node *)0x0;
  prev = pNVar4;
  if (*(long *)(pNVar4 + 0x18) == 0) {
    __assert_fail("!\"element is not in the map\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x1b7,
                  "void DirectChainedMap<IdentifierLookupResult>::remove(unsigned int, Value) [Value = IdentifierLookupResult]"
                 );
  }
  while ((prev != (Node *)0x0 &&
         ((*(uint *)prev != (uint)__filename ||
          (bVar2 = IdentifierLookupResult::operator==
                             ((IdentifierLookupResult *)(prev + 8),
                              (IdentifierLookupResult *)&this_local), !bVar2))))) {
    local_48 = prev;
    prev = *(Node **)(prev + 0x18);
    if (prev == pNVar4) {
LAB_001ecd31:
      return (int)prev;
    }
  }
  this->count = this->count - 1;
  if (prev == (Node *)0x0) {
    __assert_fail("curr && \"element is not in the map\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x1c9,
                  "void DirectChainedMap<IdentifierLookupResult>::remove(unsigned int, Value) [Value = IdentifierLookupResult]"
                 );
  }
  if (local_48 == (Node *)0x0) {
    if (*(Node **)(pNVar4 + 0x18) == pNVar4) {
      *(undefined8 *)(pNVar4 + 0x18) = 0;
      prev = pNVar4;
    }
    else {
      (*this->allocator->_vptr_Allocator[3])(this->allocator,*(undefined8 *)(pNVar4 + 0x18));
      puVar1 = *(undefined8 **)(pNVar4 + 0x18);
      *(undefined8 *)pNVar4 = *puVar1;
      *(undefined8 *)(pNVar4 + 8) = puVar1[1];
      *(undefined8 *)(pNVar4 + 0x10) = puVar1[2];
      *(undefined8 *)(pNVar4 + 0x18) = puVar1[3];
      prev = pNVar4;
    }
  }
  else {
    *(undefined8 *)(local_48 + 0x18) = *(undefined8 *)(prev + 0x18);
    uVar3 = (*this->allocator->_vptr_Allocator[3])(this->allocator,prev);
    prev = (Node *)(ulong)uVar3;
  }
  goto LAB_001ecd31;
}

Assistant:

void remove(unsigned hash, Value value)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *start = &data[bucket];
		Node *curr = start;
		Node *prev = NULL;

		if(!curr->next)
		{
			assert(!"element is not in the map");
			return;
		}

		while(curr)
		{
			if(curr->hash == hash && curr->value == value)
				break;

			prev = curr;
			curr = curr->next;

			if(curr == start)
				return;
		}

		count--;

		assert(curr && "element is not in the map");

		if(prev)
		{
			prev->next = curr->next;

			allocator->dealloc(curr);
		}
		else if(start->next == start)
		{
			start->next = NULL;
		}
		else
		{
			allocator->dealloc(start->next);

			*start = *start->next;
		}
	}